

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O0

int crypt_init_arcfour128
              (LIBSSH2_SESSION *session,LIBSSH2_CRYPT_METHOD *method,uchar *iv,int *free_iv,
              uchar *secret,int *free_secret,int encrypt,void **abstract)

{
  int iVar1;
  long local_58;
  size_t discard;
  uchar block [8];
  crypt_ctx *cctx;
  int rc;
  int *free_secret_local;
  uchar *secret_local;
  int *free_iv_local;
  uchar *iv_local;
  LIBSSH2_CRYPT_METHOD *method_local;
  LIBSSH2_SESSION *session_local;
  
  iVar1 = crypt_init(session,method,iv,free_iv,secret,free_secret,encrypt,abstract);
  if (iVar1 == 0) {
    block = (uchar  [8])*abstract;
    for (local_58 = 0x600; local_58 != 0; local_58 = local_58 + -8) {
      _libssh2_cipher_crypt
                ((EVP_CIPHER_CTX **)((long)block + 0x10),*(_func_EVP_CIPHER_ptr **)((long)block + 8)
                 ,*(int *)block,(uchar *)&discard,(long)method->blocksize,0);
    }
  }
  return iVar1;
}

Assistant:

static int
crypt_init_arcfour128(LIBSSH2_SESSION * session,
                      const LIBSSH2_CRYPT_METHOD * method,
                      unsigned char *iv, int *free_iv,
                      unsigned char *secret, int *free_secret,
                      int encrypt, void **abstract)
{
    int rc;

    rc = crypt_init(session, method, iv, free_iv, secret, free_secret,
                    encrypt, abstract);
    if(rc == 0) {
        struct crypt_ctx *cctx = *(struct crypt_ctx **) abstract;
        unsigned char block[8];
        size_t discard = 1536;
        for(; discard; discard -= 8)
            _libssh2_cipher_crypt(&cctx->h, cctx->algo, cctx->encrypt, block,
                                  method->blocksize, MIDDLE_BLOCK);
                               /* Not all middle, but here it doesn't matter */
    }

    return rc;
}